

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3VMPrintf(sqlite3 *db,char *zFormat,__va_list_tag *ap)

{
  long in_FS_OFFSET;
  undefined1 local_a0 [8];
  StrAccum acc;
  char *z;
  __va_list_tag *ap_local;
  char *zFormat_local;
  sqlite3 *db_local;
  char zBase [70];
  
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  sqlite3StrAccumInit((StrAccum *)local_a0,db,(char *)&db_local,0x46,db->aLimit[0]);
  acc.nAlloc._1_1_ = 1;
  sqlite3VXPrintf((StrAccum *)local_a0,zFormat,ap);
  acc._32_8_ = sqlite3StrAccumFinish((StrAccum *)local_a0);
  if ((char)acc.nAlloc == '\x01') {
    sqlite3OomFault(db);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == stack0xfffffffffffffff0) {
    return (char *)acc._32_8_;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE char *sqlite3VMPrintf(sqlite3 *db, const char *zFormat, va_list ap){
  char *z;
  char zBase[SQLITE_PRINT_BUF_SIZE];
  StrAccum acc;
  assert( db!=0 );
  sqlite3StrAccumInit(&acc, db, zBase, sizeof(zBase),
                      db->aLimit[SQLITE_LIMIT_LENGTH]);
  acc.printfFlags = SQLITE_PRINTF_INTERNAL;
  sqlite3VXPrintf(&acc, zFormat, ap);
  z = sqlite3StrAccumFinish(&acc);
  if( acc.accError==STRACCUM_NOMEM ){
    sqlite3OomFault(db);
  }
  return z;
}